

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O2

int ly_utf8_and_equal(char *input,int bytes,...)

{
  byte *pbVar1;
  char in_AL;
  ulong uVar2;
  undefined8 in_RCX;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  undefined8 in_RDX;
  ulong uVar7;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  uint local_b8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list ap;
  
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (in_AL != '\0') {
    uStack_88 = in_XMM0_Qa;
    ap[0].overflow_arg_area = in_XMM1_Qa;
  }
  puVar4 = (uint *)&stack0x00000008;
  uVar5 = 0x10;
  uVar2 = 0;
  uVar7 = (ulong)(uint)bytes;
  if (bytes < 1) {
    uVar7 = uVar2;
  }
  do {
    if (uVar7 == uVar2) {
      return 1;
    }
    if (uVar5 < 0x29) {
      uVar6 = uVar5 + 8;
      uVar8 = *(uint *)((long)local_b8 + (ulong)uVar5);
      puVar3 = puVar4;
      if (0x20 < uVar5) goto LAB_0010efb5;
      puVar3 = (uint *)((long)local_b8 + (ulong)uVar6);
      uVar5 = uVar5 + 0x10;
    }
    else {
      uVar8 = *puVar4;
      puVar3 = puVar4 + 2;
      uVar6 = uVar5;
LAB_0010efb5:
      puVar4 = puVar3 + 2;
      uVar5 = uVar6;
    }
    pbVar1 = (byte *)(input + uVar2);
    uVar2 = uVar2 + 1;
    if ((*pbVar1 & uVar8) != (uint)(byte)*puVar3) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
ly_utf8_and_equal(const char *input, int bytes, ...)
{
    va_list ap;
    int i, and, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        and = va_arg(ap, int);
        byte = va_arg(ap, int);

        /* compare each byte */
        if (((uint8_t)input[i] & and) != (uint8_t)byte) {
            return 0;
        }
    }
    va_end(ap);

    return 1;
}